

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall backward::SourceFile::SourceFile(SourceFile *this,string *path)

{
  pointer pbVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar4;
  long lVar5;
  ulong uVar6;
  string new_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->_file)._val = (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
  (this->_file)._empty = true;
  pvVar3 = get_paths_from_env_variable_abi_cxx11_(this);
  uVar6 = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    pbVar1 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = uVar6 + 1;
    if ((ulong)((long)(pvVar3->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6)
    break;
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar1->_M_dataplus)._M_p + lVar5),'/');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_path,
                   &local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar4 = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
    std::ifstream::ifstream(pbVar4,new_path._M_dataplus._M_p,_S_in);
    details::
    handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
    ::reset(&this->_file,pbVar4);
    bVar2 = is_open(this);
    lVar5 = lVar5 + 0x20;
    std::__cxx11::string::~string((string *)&new_path);
  } while (!bVar2);
  if ((((this->_file)._empty == false) &&
      ((this->_file)._val != (basic_ifstream<char,_std::char_traits<char>_> *)0x0)) &&
     (bVar2 = is_open(this), bVar2)) {
    return;
  }
  pbVar4 = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(pbVar4,(path->_M_dataplus)._M_p,_S_in);
  details::
  handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
  ::reset(&this->_file,pbVar4);
  return;
}

Assistant:

SourceFile(const std::string &path) {
    // 1. If BACKWARD_CXX_SOURCE_PREFIXES is set then assume it contains
    //    a colon-separated list of path prefixes.  Try prepending each
    //    to the given path until a valid file is found.
    const std::vector<std::string> &prefixes = get_paths_from_env_variable();
    for (size_t i = 0; i < prefixes.size(); ++i) {
      // Double slashes (//) should not be a problem.
      std::string new_path = prefixes[i] + '/' + path;
      _file.reset(new std::ifstream(new_path.c_str()));
      if (is_open())
        break;
    }
    // 2. If no valid file found then fallback to opening the path as-is.
    if (!_file || !is_open()) {
      _file.reset(new std::ifstream(path.c_str()));
    }
  }